

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::InitAutogenTarget(cmQtAutoGenInitializer *this)

{
  cmTarget *this_00;
  cmLocalGenerator *pcVar1;
  unsigned_long uVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  bool bVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  reference ppVar4;
  vector<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  reference filename;
  ulong uVar5;
  string *psVar6;
  long lVar7;
  set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_> *psVar8;
  reference ppcVar9;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_03;
  pointer pcVar10;
  char *pcVar11;
  reference config_00;
  cmLinkImplementationLibraries *this_04;
  mapped_type_conflict2 *pmVar12;
  reference ppVar13;
  size_type sVar14;
  iterator __first;
  iterator __last;
  cmLocalGenerator *pcVar15;
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  *this_05;
  reference name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_06;
  basic_string_view<char,_std::char_traits<char>_> bVar16;
  undefined1 auVar17 [16];
  pair<std::_Rb_tree_const_iterator<cmTarget_*>,_bool> pVar18;
  bool local_c62;
  allocator<char> local_c61;
  string local_c60;
  cmTarget *local_c40;
  cmTarget *depTarget_1;
  iterator __end3_5;
  iterator __begin3_5;
  set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_> *__range3_5;
  BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  *depName;
  iterator __end3_4;
  iterator __begin3_4;
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  *__range3_4;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_bf8;
  cmLocalGenerator *local_bf0;
  cmTarget *autogenTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_bd0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_bb8;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_ba0;
  __single_object cc_2;
  cmCustomCommandLines local_b90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b60;
  string local_b48;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_b28;
  basic_string_view<char,_std::char_traits<char>_> local_b20;
  basic_string_view<char,_std::char_traits<char>_> local_b10;
  basic_string_view<char,_std::char_traits<char>_> local_b00;
  undefined1 local_af0 [16];
  iterator local_ae0;
  undefined8 local_ad8;
  cmCustomCommandLine local_ad0;
  cmAlphaNum local_ab8;
  cmAlphaNum local_a88;
  string local_a58;
  cmAlphaNum local_a38;
  cmAlphaNum local_a08;
  string local_9d8;
  cmAlphaNum local_9b8;
  cmAlphaNum local_988;
  undefined1 local_958 [8];
  string outputFile;
  char timestampFileName [10];
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_908;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_900;
  cmLocalGenerator *local_8f8;
  cmTarget *timestampTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8c0;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_8a8;
  __single_object cc_3;
  cmAlphaNum local_870;
  string local_840;
  TargetType local_81c;
  undefined1 local_818 [4];
  TargetType ttype;
  string depname;
  cmTarget *t;
  iterator __end3_3;
  iterator __begin3_3;
  set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_> *__range3_3;
  cmCustomCommandLines timestampTargetCommandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  timestampTargetProvides;
  cmAlphaNum local_778;
  undefined1 local_748 [8];
  string timestampTargetName;
  undefined1 local_710 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  pair<const_cmGeneratorTarget_*const,_unsigned_long> *item_1;
  iterator __end3_2;
  iterator __begin3_2;
  map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
  *__range3_2;
  cmGeneratorTarget *libTarget;
  cmLinkItem *item;
  const_iterator __end5;
  const_iterator __begin5;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range5;
  cmLinkImplementationLibraries *libs;
  string *config_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
  commonTargets;
  cmCustomCommandLines local_638;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_620;
  undefined1 local_608 [8];
  cmCustomCommand cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  string local_4b0;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_490;
  __single_object cc_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *uiFile;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uicDependencies;
  basic_string_view<char,_std::char_traits<char>_> local_440;
  basic_string_view<char,_std::char_traits<char>_> local_430;
  undefined1 local_420 [16];
  pointer *local_410;
  undefined8 local_408;
  cmCustomCommandLine local_400;
  string_view local_3e8;
  string_view local_3d8;
  string_view local_3c8;
  string_view local_3b8;
  cmAlphaNum local_3a8;
  cmAlphaNum local_378;
  string local_348;
  string_view local_328;
  undefined1 local_318 [8];
  string timestampFileGenex;
  ConfigString timestampFile;
  cmTarget *depTarget;
  iterator __end2_1;
  iterator __begin2_1;
  set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_> *__range2_1;
  byte local_259;
  undefined1 auStack_258 [7];
  bool usePRE_BUILD;
  char *local_250;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  iterator local_208;
  undefined8 local_200;
  cmCustomCommandLine local_1f8;
  reference local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmCustomCommandLines commandLines;
  undefined1 local_1a0 [7];
  bool stdPipesUTF8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmAlphaNum local_158;
  string local_128;
  undefined1 local_108 [8];
  string tools;
  string autogenComment;
  pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *file;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p;
  iterator __end4;
  iterator __begin4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range4;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  timestampByproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  autogenByproducts;
  string local_40 [36];
  IntegerVersion local_1c;
  byte local_11;
  cmQtAutoGenInitializer *pcStack_10;
  bool useNinjaDepfile;
  cmQtAutoGenInitializer *this_local;
  
  pcStack_10 = this;
  cmMakefile::AddCMakeOutputFile(this->Makefile,&(this->AutogenTarget).InfoFile);
  cmQtAutoGen::IntegerVersion::IntegerVersion(&local_1c,5,0xf);
  bVar3 = cmQtAutoGen::IntegerVersion::operator>=(&this->QtVersion,local_1c);
  local_c62 = false;
  local_11 = local_c62;
  if (bVar3) {
    (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(local_40);
    lVar7 = std::__cxx11::string::find((char *)local_40,0xbc658f);
    std::__cxx11::string::~string(local_40);
    local_11 = lVar7 != -1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&timestampByproducts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
  if (((this->Moc).super_GenVarsT.Enabled & 1U) != 0) {
    AddGeneratedSource(this,&(this->Moc).CompilationFile,&(this->Moc).super_GenVarsT,true);
    if ((local_11 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&timestampByproducts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  &(this->Moc).CompilationFileGenex);
    }
    else if ((this->MultiConfig & 1U) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78,&(this->Moc).CompilationFileGenex);
    }
    else {
      this_01 = &(this->Moc).CompilationFile.Config;
      __end4 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(this_01);
      p = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(this_01);
      while (bVar3 = std::__detail::operator!=
                               (&__end4.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                  *)&p), bVar3) {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                 ::operator*(&__end4);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_78,&ppVar4->second);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
        ::operator++(&__end4);
      }
    }
  }
  if (((this->Uic).super_GenVarsT.Enabled & 1U) != 0) {
    this_02 = &(this->Uic).UiHeaders;
    __end2 = std::
             vector<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(this_02);
    file = (pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(this_02);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)&file), bVar3) {
      filename = __gnu_cxx::
                 __normal_iterator<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator*(&__end2);
      AddGeneratedSource(this,&filename->first,&(this->Uic).super_GenVarsT,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&timestampByproducts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&filename->second);
      __gnu_cxx::
      __normal_iterator<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  std::__cxx11::string::string((string *)(tools.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_108);
  if (((this->Moc).super_GenVarsT.Enabled & 1U) != 0) {
    std::__cxx11::string::operator+=((string *)local_108,"MOC");
  }
  if (((this->Uic).super_GenVarsT.Enabled & 1U) != 0) {
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)local_108," and ");
    }
    std::__cxx11::string::operator+=((string *)local_108,"UIC");
  }
  cmAlphaNum::cmAlphaNum(&local_158,"Automatic ");
  cmAlphaNum::cmAlphaNum
            ((cmAlphaNum *)
             &configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_108);
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
  cmStrCat<char[13],std::__cxx11::string>
            (&local_128,&local_158,
             (cmAlphaNum *)
             &configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [13])0xbef2db,psVar6);
  std::__cxx11::string::operator=((string *)(tools.field_2._M_local_buf + 8),(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1a0);
  (*this->GlobalGen->_vptr_cmGlobalGenerator[0x38])
            (this->GlobalGen,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1a0);
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  cmCustomCommandLines::cmCustomCommandLines((cmCustomCommandLines *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1a0);
  config = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1a0);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&config);
    if (!bVar3) break;
    local_1e0 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    psVar6 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    bVar16 = (basic_string_view<char,_std::char_traits<char>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    _auStack_258 = bVar16;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"-E");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_238,"cmake_autogen");
    auVar17 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&(this->AutogenTarget).InfoFile);
    local_228 = auVar17;
    auVar17 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1e0);
    local_208 = (iterator)auStack_258;
    local_200 = 5;
    ilist_01._M_len = 5;
    ilist_01._M_array = local_208;
    local_218 = auVar17;
    cmMakeCommandLine(&local_1f8,ilist_01);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)&__range1,
               &local_1f8);
    cmCustomCommandLine::~cmCustomCommandLine(&local_1f8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  local_259 = 0;
  (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(&__range2_1);
  lVar7 = std::__cxx11::string::find((char *)&__range2_1,0xbee054);
  std::__cxx11::string::~string((string *)&__range2_1);
  if (lVar7 != -1) {
    local_259 = 1;
  }
  if ((local_259 & 1) != 0) {
    bVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&(this->AutogenTarget).DependFiles);
    if (!bVar3) {
      local_259 = 0;
    }
    if (((this->AutogenTarget).GlobalTarget & 1U) != 0) {
      local_259 = 0;
    }
  }
  if ((local_259 & 1) == 0) {
    if (((this->AutogenTarget).DependOrigin & 1U) != 0) {
      std::
      map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
      ::map((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
             *)&__range3_1);
      __end3_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->ConfigsList);
      config_1 = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->ConfigsList);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end3_1,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&config_1);
        if (!bVar3) break;
        config_00 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3_1);
        this_04 = cmGeneratorTarget::GetLinkImplementationLibraries(this->GenTarget,config_00,Link);
        if (this_04 != (cmLinkImplementationLibraries *)0x0) {
          __end5 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                             (&this_04->Libraries);
          item = (cmLinkItem *)
                 std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                           (&this_04->Libraries);
          while( true ) {
            bVar3 = __gnu_cxx::operator!=
                              (&__end5,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                        *)&item);
            if (!bVar3) break;
            libTarget = (cmGeneratorTarget *)
                        __gnu_cxx::
                        __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                        ::operator*(&__end5);
            __range3_2 = *(map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                           **)&libTarget->ObjectDirectory;
            if ((cmGeneratorTarget *)__range3_2 != (cmGeneratorTarget *)0x0) {
              bVar3 = anon_unknown.dwarf_faacfb::StaticLibraryCycle
                                (this->GenTarget,(cmGeneratorTarget *)__range3_2,config_00);
              if (!bVar3) {
                pmVar12 = std::
                          map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                          ::operator[]((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                                        *)&__range3_1,(key_type *)&__range3_2);
                *pmVar12 = *pmVar12 + 1;
              }
            }
            __gnu_cxx::
            __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
            ::operator++(&__end5);
          }
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3_1);
      }
      __end3_2 = std::
                 map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                 ::begin((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                          *)&__range3_1);
      item_1 = (pair<const_cmGeneratorTarget_*const,_unsigned_long> *)
               std::
               map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
               ::end((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                      *)&__range3_1);
      while( true ) {
        bVar3 = std::operator!=(&__end3_2,(_Self *)&item_1);
        if (!bVar3) break;
        ppVar13 = std::_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>
                  ::operator*(&__end3_2);
        uVar2 = ppVar13->second;
        sVar14 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&this->ConfigsList);
        if (uVar2 == sVar14) {
          pVar18 = std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::insert
                             (&(this->AutogenTarget).DependTargets,&ppVar13->first->Target);
          dependencies.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVar18.first._M_node;
        }
        std::_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>::
        operator++(&__end3_2);
      }
      std::
      map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
      ::~map((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
              *)&__range3_1);
    }
    this_06 = &(this->AutogenTarget).DependFiles;
    __first = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(this_06);
    __last = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_06);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(timestampTargetName.field_2._M_local_buf + 0xf));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_710,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__first._M_node,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__last._M_node,
               (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(timestampTargetName.field_2._M_local_buf + 0xf));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(timestampTargetName.field_2._M_local_buf + 0xf));
    if ((local_11 & 1) != 0) {
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
      cmAlphaNum::cmAlphaNum(&local_778,psVar6);
      cmAlphaNum::cmAlphaNum
                ((cmAlphaNum *)
                 &timestampTargetProvides.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"_autogen_timestamp_deps");
      cmStrCat<>((string *)local_748,&local_778,
                 (cmAlphaNum *)
                 &timestampTargetProvides.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&timestampTargetCommandLines.
                   super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                   super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
      cmCustomCommandLines::cmCustomCommandLines((cmCustomCommandLines *)&__range3_3);
      psVar8 = &(this->AutogenTarget).DependTargets;
      __end3_3 = std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::begin
                           (psVar8);
      t = (cmTarget *)
          std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::end(psVar8);
      while( true ) {
        bVar3 = std::operator!=(&__end3_3,(_Self *)&t);
        if (!bVar3) break;
        ppcVar9 = std::_Rb_tree_const_iterator<cmTarget_*>::operator*(&__end3_3);
        depname.field_2._8_8_ = *ppcVar9;
        psVar6 = cmTarget::GetName_abi_cxx11_((cmTarget *)depname.field_2._8_8_);
        std::__cxx11::string::string((string *)local_818,(string *)psVar6);
        bVar3 = cmTarget::IsImported((cmTarget *)depname.field_2._8_8_);
        if (bVar3) {
          local_81c = cmTarget::GetType((cmTarget *)depname.field_2._8_8_);
          if (((local_81c == STATIC_LIBRARY) || (local_81c == SHARED_LIBRARY)) ||
             (local_81c == UNKNOWN_LIBRARY)) {
            cmAlphaNum::cmAlphaNum(&local_870,"$<TARGET_LINKER_FILE:");
            psVar6 = cmTarget::GetName_abi_cxx11_((cmTarget *)depname.field_2._8_8_);
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)&cc_3,psVar6);
            cmStrCat<char[2]>(&local_840,&local_870,(cmAlphaNum *)&cc_3,(char (*) [2])0xc023bd);
            std::__cxx11::string::operator=((string *)local_818,(string *)&local_840);
            std::__cxx11::string::~string((string *)&local_840);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_710,(value_type *)local_818);
        std::__cxx11::string::~string((string *)local_818);
        std::_Rb_tree_const_iterator<cmTarget_*>::operator++(&__end3_3);
      }
      std::make_unique<cmCustomCommand>();
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      cmCustomCommand::SetWorkingDirectory(pcVar10,pcVar11);
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_8c0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&timestampTargetCommandLines.
                   super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                   super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
      cmCustomCommand::SetByproducts(pcVar10,&local_8c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_8c0);
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_8d8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_710);
      cmCustomCommand::SetDepends(pcVar10,&local_8d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_8d8);
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      cmCustomCommandLines::cmCustomCommandLines
                ((cmCustomCommandLines *)&timestampTarget,(cmCustomCommandLines *)&__range3_3);
      cmCustomCommand::SetCommandLines(pcVar10,(cmCustomCommandLines *)&timestampTarget);
      cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)&timestampTarget);
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      cmCustomCommand::SetCMP0116Status(pcVar10,NEW);
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      cmCustomCommand::SetEscapeOldStyle(pcVar10,false);
      pcVar1 = this->LocalGen;
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
                (&local_900,&local_8a8);
      pcVar15 = (cmLocalGenerator *)
                cmLocalGenerator::AddUtilityCommand(pcVar1,(string *)local_748,true,&local_900);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                (&local_900);
      pcVar1 = this->LocalGen;
      local_8f8 = pcVar15;
      std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*&>
                ((cmTarget **)&local_908,&local_8f8);
      cmLocalGenerator::AddGeneratorTarget(pcVar1,&local_908);
      std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                (&local_908);
      uVar5 = std::__cxx11::string::empty();
      pcVar1 = local_8f8;
      if ((uVar5 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(timestampFileName + 8),"FOLDER",
                   (allocator<char> *)(timestampFileName + 7));
        cmTarget::SetProperty
                  ((cmTarget *)pcVar1,(string *)(timestampFileName + 8),&this->TargetsFolder);
        std::__cxx11::string::~string((string *)(timestampFileName + 8));
        std::allocator<char>::~allocator((allocator<char> *)(timestampFileName + 7));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_710);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_710,(value_type *)local_748);
      anon_unknown.dwarf_faacfb::AddAutogenExecutableToDependencies
                (&(this->Moc).super_GenVarsT,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_710);
      anon_unknown.dwarf_faacfb::AddAutogenExecutableToDependencies
                (&(this->Uic).super_GenVarsT,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_710);
      outputFile.field_2._8_8_ = 0x6d617473656d6974;
      timestampFileName[0] = 'p';
      timestampFileName[1] = '\0';
      cmAlphaNum::cmAlphaNum(&local_988,&(this->Dir).Build);
      cmAlphaNum::cmAlphaNum(&local_9b8,"/");
      cmStrCat<char[10]>((string *)local_958,&local_988,&local_9b8,
                         (char (*) [10])((long)&outputFile.field_2 + 8));
      cmAlphaNum::cmAlphaNum(&local_a08,&(this->Dir).Build);
      cmAlphaNum::cmAlphaNum(&local_a38,"/deps");
      cmStrCat<>(&local_9d8,&local_a08,&local_a38);
      std::__cxx11::string::operator=((string *)&(this->AutogenTarget).DepFile,(string *)&local_9d8)
      ;
      std::__cxx11::string::~string((string *)&local_9d8);
      cmAlphaNum::cmAlphaNum(&local_a88,&(this->Dir).RelativeBuild);
      cmAlphaNum::cmAlphaNum(&local_ab8,"/");
      cmStrCat<char[10]>(&local_a58,&local_a88,&local_ab8,
                         (char (*) [10])((long)&outputFile.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)&(this->AutogenTarget).DepFileRuleName,(string *)&local_a58);
      std::__cxx11::string::~string((string *)&local_a58);
      psVar6 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      local_b20 = (basic_string_view<char,_std::char_traits<char>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b10,"-E");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b00,"touch");
      local_af0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_958);
      local_ae0 = &local_b20;
      local_ad8 = 4;
      ilist._M_len = 4;
      ilist._M_array = local_ae0;
      cmMakeCommandLine(&local_ad0,ilist);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)&__range1,
                 &local_ad0);
      cmCustomCommandLine::~cmCustomCommandLine(&local_ad0);
      AddGeneratedSource(this,(string *)local_958,&(this->Moc).super_GenVarsT,false);
      std::make_unique<cmCustomCommand>();
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator=
                (&local_8a8,&local_b28);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                (&local_b28);
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      std::__cxx11::string::string((string *)&local_b48,(string *)local_958);
      cmCustomCommand::SetOutputs(pcVar10,&local_b48);
      std::__cxx11::string::~string((string *)&local_b48);
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_b60,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78);
      cmCustomCommand::SetByproducts(pcVar10,&local_b60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b60);
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_b78,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_710);
      cmCustomCommand::SetDepends(pcVar10,&local_b78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b78);
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      cmCustomCommandLines::cmCustomCommandLines(&local_b90,(cmCustomCommandLines *)&__range1);
      cmCustomCommand::SetCommandLines(pcVar10,&local_b90);
      cmCustomCommandLines::~cmCustomCommandLines(&local_b90);
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      cmCustomCommand::SetComment(pcVar10,pcVar11);
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      cmCustomCommand::SetWorkingDirectory(pcVar10,pcVar11);
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      cmCustomCommand::SetCMP0116Status(pcVar10,NEW);
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      cmCustomCommand::SetEscapeOldStyle(pcVar10,false);
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      cmCustomCommand::SetDepfile(pcVar10,&(this->AutogenTarget).DepFile);
      pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_8a8);
      cmCustomCommand::SetStdPipesUTF8
                (pcVar10,(bool)(commandLines.
                                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                .
                                super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      pcVar1 = this->LocalGen;
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
                (&cc_2,&local_8a8);
      cmLocalGenerator::AddCustomCommandToOutput(pcVar1,&cc_2,false);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&cc_2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_710);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_710,(value_type *)local_958);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::clear
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)&__range1);
      std::__cxx11::string::clear();
      std::__cxx11::string::~string((string *)local_958);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                (&local_8a8);
      cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)&__range3_3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&timestampTargetCommandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_748);
    }
    std::make_unique<cmCustomCommand>();
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_ba0);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    cmCustomCommand::SetWorkingDirectory(pcVar10,pcVar11);
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_ba0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_bb8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&timestampByproducts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmCustomCommand::SetByproducts(pcVar10,&local_bb8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_bb8);
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_ba0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_bd0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_710);
    cmCustomCommand::SetDepends(pcVar10,&local_bd0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_bd0);
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_ba0);
    cmCustomCommandLines::cmCustomCommandLines
              ((cmCustomCommandLines *)&autogenTarget,(cmCustomCommandLines *)&__range1);
    cmCustomCommand::SetCommandLines(pcVar10,(cmCustomCommandLines *)&autogenTarget);
    cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)&autogenTarget);
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_ba0);
    cmCustomCommand::SetCMP0116Status(pcVar10,NEW);
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_ba0);
    cmCustomCommand::SetEscapeOldStyle(pcVar10,false);
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_ba0);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    cmCustomCommand::SetComment(pcVar10,pcVar11);
    pcVar1 = this->LocalGen;
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
              (&local_bf8,&local_ba0);
    pcVar15 = (cmLocalGenerator *)
              cmLocalGenerator::AddUtilityCommand
                        (pcVar1,&(this->AutogenTarget).Name,true,&local_bf8);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_bf8)
    ;
    pcVar1 = this->LocalGen;
    local_bf0 = pcVar15;
    std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*&>
              ((cmTarget **)&__range3_4,&local_bf0);
    cmLocalGenerator::AddGeneratorTarget
              (pcVar1,(unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                      &__range3_4);
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)&__range3_4
              );
    if (((this->AutogenTarget).DependOrigin & 1U) != 0) {
      this_05 = cmGeneratorTarget::GetUtilities_abi_cxx11_(this->GenTarget);
      __end3_4 = std::
                 set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                 ::begin(this_05);
      depName = (BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                 *)std::
                   set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                   ::end(this_05);
      while( true ) {
        bVar3 = std::operator!=(&__end3_4,(_Self *)&depName);
        if (!bVar3) break;
        name = std::
               _Rb_tree_const_iterator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ::operator*(&__end3_4);
        cmTarget::AddUtility((cmTarget *)local_bf0,(string *)name,false,this->Makefile);
        std::
        _Rb_tree_const_iterator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ::operator++(&__end3_4);
      }
    }
    if ((local_11 & 1) == 0) {
      psVar8 = &(this->AutogenTarget).DependTargets;
      __end3_5 = std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::begin
                           (psVar8);
      depTarget_1 = (cmTarget *)
                    std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::end
                              (psVar8);
      while( true ) {
        bVar3 = std::operator!=(&__end3_5,(_Self *)&depTarget_1);
        if (!bVar3) break;
        ppcVar9 = std::_Rb_tree_const_iterator<cmTarget_*>::operator*(&__end3_5);
        pcVar1 = local_bf0;
        local_c40 = *ppcVar9;
        psVar6 = cmTarget::GetName_abi_cxx11_(local_c40);
        cmTarget::AddUtility((cmTarget *)pcVar1,psVar6,false,this->Makefile);
        std::_Rb_tree_const_iterator<cmTarget_*>::operator++(&__end3_5);
      }
    }
    uVar5 = std::__cxx11::string::empty();
    pcVar1 = local_bf0;
    if ((uVar5 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c60,"FOLDER",&local_c61);
      cmTarget::SetProperty((cmTarget *)pcVar1,&local_c60,&this->TargetsFolder);
      std::__cxx11::string::~string((string *)&local_c60);
      std::allocator<char>::~allocator(&local_c61);
    }
    cmTarget::AddUtility(this->GenTarget->Target,&(this->AutogenTarget).Name,false,this->Makefile);
    if (((this->AutogenTarget).GlobalTarget & 1U) != 0) {
      cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen
                (this->GlobalInitializer,this->LocalGen,&(this->AutogenTarget).Name);
    }
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_ba0)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_710);
    goto LAB_0074bb5b;
  }
  psVar8 = &(this->AutogenTarget).DependTargets;
  __end2_1 = std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::begin(psVar8)
  ;
  depTarget = (cmTarget *)
              std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::end(psVar8);
  while( true ) {
    bVar3 = std::operator!=(&__end2_1,(_Self *)&depTarget);
    if (!bVar3) break;
    ppcVar9 = std::_Rb_tree_const_iterator<cmTarget_*>::operator*(&__end2_1);
    this_00 = this->GenTarget->Target;
    psVar6 = cmTarget::GetName_abi_cxx11_(*ppcVar9);
    cmTarget::AddUtility(this_00,psVar6,false,this->Makefile);
    std::_Rb_tree_const_iterator<cmTarget_*>::operator++(&__end2_1);
  }
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&(this->Uic).UiFilesNoOptions);
  if (bVar3) {
    bVar3 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::empty(&(this->Uic).UiFilesWithOptions);
    if (!bVar3) goto LAB_00749deb;
  }
  else {
LAB_00749deb:
    ConfigString::ConfigString((ConfigString *)((long)&timestampFileGenex.field_2 + 8));
    std::__cxx11::string::string((string *)local_318);
    cmAlphaNum::cmAlphaNum(&local_378,&(this->Dir).Build);
    local_3c8 = (string_view)::cm::operator____s("/autouic",8);
    local_3b8 = local_3c8;
    cmAlphaNum::cmAlphaNum(&local_3a8,local_3c8);
    cmStrCat<>(&local_348,&local_378,&local_3a8);
    local_328 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_348);
    local_3e8 = (string_view)::cm::operator____s(".stamp",6);
    local_3d8 = local_3e8;
    ConfigFileNamesAndGenex
              (this,(ConfigString *)((long)&timestampFileGenex.field_2 + 8),(string *)local_318,
               local_328,local_3e8);
    std::__cxx11::string::~string((string *)&local_348);
    AddGeneratedSource(this,(ConfigString *)((long)&timestampFileGenex.field_2 + 8),
                       &(this->Uic).super_GenVarsT,false);
    psVar6 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    uicDependencies.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_440,"-E");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_430,"touch");
    local_420 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_318);
    local_410 = &uicDependencies.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_408 = 4;
    ilist_00._M_len = 4;
    ilist_00._M_array = (iterator)local_410;
    cmMakeCommandLine(&local_400,ilist_00);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)&__range1,
               &local_400);
    cmCustomCommandLine::~cmCustomCommandLine(&local_400);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range3,&(this->Uic).UiFilesNoOptions);
    this_03 = &(this->Uic).UiFilesWithOptions;
    __end3 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::begin(this_03);
    uiFile = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::end(this_03);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                  *)&uiFile);
      if (!bVar3) break;
      cc_1._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
           __gnu_cxx::
           __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::operator*(&__end3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range3,
                  (value_type *)
                  cc_1._M_t.
                  super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t
                  .super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::operator++(&__end3);
    }
    anon_unknown.dwarf_faacfb::AddAutogenExecutableToDependencies
              (&(this->Uic).super_GenVarsT,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range3);
    std::make_unique<cmCustomCommand>();
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_490);
    std::__cxx11::string::string((string *)&local_4b0,(string *)local_318);
    cmCustomCommand::SetOutputs(pcVar10,&local_4b0);
    std::__cxx11::string::~string((string *)&local_4b0);
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_490);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_4c8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range3);
    cmCustomCommand::SetDepends(pcVar10,&local_4c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4c8);
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_490);
    cmCustomCommand::SetComment(pcVar10,"");
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_490);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    cmCustomCommand::SetWorkingDirectory(pcVar10,pcVar11);
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_490);
    cmCustomCommand::SetCMP0116Status(pcVar10,NEW);
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_490);
    cmCustomCommand::SetEscapeOldStyle(pcVar10,false);
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_490);
    cmCustomCommand::SetStdPipesUTF8
              (pcVar10,(bool)(commandLines.
                              super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                              .
                              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
    pcVar1 = this->LocalGen;
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
               &cc.CMP0116Status,&local_490);
    cmLocalGenerator::AddCustomCommandToOutput
              (pcVar1,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                      &cc.CMP0116Status,false);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
               &cc.CMP0116Status);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_490)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range3);
    std::__cxx11::string::~string((string *)local_318);
    ConfigString::~ConfigString((ConfigString *)((long)&timestampFileGenex.field_2 + 8));
  }
  cmCustomCommand::cmCustomCommand((cmCustomCommand *)local_608);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_620,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&timestampByproducts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCustomCommand::SetByproducts((cmCustomCommand *)local_608,&local_620);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_620);
  cmCustomCommandLines::cmCustomCommandLines(&local_638,(cmCustomCommandLines *)&__range1);
  cmCustomCommand::SetCommandLines((cmCustomCommand *)local_608,&local_638);
  cmCustomCommandLines::~cmCustomCommandLines(&local_638);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  cmCustomCommand::SetComment((cmCustomCommand *)local_608,pcVar11);
  cmMakefile::GetBacktrace
            ((cmMakefile *)&commonTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cmCustomCommand::SetBacktrace
            ((cmCustomCommand *)local_608,
             (cmListFileBacktrace *)&commonTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  cmListFileBacktrace::~cmListFileBacktrace
            ((cmListFileBacktrace *)&commonTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  pcVar11 = (char *)std::__cxx11::string::c_str();
  cmCustomCommand::SetWorkingDirectory((cmCustomCommand *)local_608,pcVar11);
  cmCustomCommand::SetStdPipesUTF8
            ((cmCustomCommand *)local_608,
             (bool)(commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
  cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_608,false);
  cmCustomCommand::SetEscapeAllowMakeVars((cmCustomCommand *)local_608,true);
  cmTarget::AddPreBuildCommand(this->GenTarget->Target,(cmCustomCommand *)local_608);
  cmCustomCommand::~cmCustomCommand((cmCustomCommand *)local_608);
LAB_0074bb5b:
  cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1a0);
  std::__cxx11::string::~string((string *)(tools.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&timestampByproducts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitAutogenTarget()
{
  // Register info file as generated by CMake
  this->Makefile->AddCMakeOutputFile(this->AutogenTarget.InfoFile);

  // Determine whether to use a depfile for the AUTOGEN target.
  const bool useNinjaDepfile = this->QtVersion >= IntegerVersion(5, 15) &&
    this->GlobalGen->GetName().find("Ninja") != std::string::npos;

  // Files provided by the autogen target
  std::vector<std::string> autogenByproducts;
  std::vector<std::string> timestampByproducts;
  if (this->Moc.Enabled) {
    this->AddGeneratedSource(this->Moc.CompilationFile, this->Moc, true);
    if (useNinjaDepfile) {
      if (this->MultiConfig) {
        // Make all mocs_compilation_<CONFIG>.cpp files byproducts of the
        // ${target}_autogen/timestamp custom command.
        // We cannot just use Moc.CompilationFileGenex here, because that
        // custom command runs cmake_autogen for each configuration.
        for (const auto& p : this->Moc.CompilationFile.Config) {
          timestampByproducts.push_back(p.second);
        }
      } else {
        timestampByproducts.push_back(this->Moc.CompilationFileGenex);
      }
    } else {
      autogenByproducts.push_back(this->Moc.CompilationFileGenex);
    }
  }

  if (this->Uic.Enabled) {
    for (const auto& file : this->Uic.UiHeaders) {
      this->AddGeneratedSource(file.first, this->Uic);
      autogenByproducts.push_back(file.second);
    }
  }

  // Compose target comment
  std::string autogenComment;
  {
    std::string tools;
    if (this->Moc.Enabled) {
      tools += "MOC";
    }
    if (this->Uic.Enabled) {
      if (!tools.empty()) {
        tools += " and ";
      }
      tools += "UIC";
    }
    autogenComment = cmStrCat("Automatic ", tools, " for target ",
                              this->GenTarget->GetName());
  }

  // Compose command lines
  // FIXME: Take advantage of our per-config mocs_compilation_$<CONFIG>.cpp
  // instead of fiddling with the include directories
  std::vector<std::string> configs;
  this->GlobalGen->GetQtAutoGenConfigs(configs);
  bool stdPipesUTF8 = true;
  cmCustomCommandLines commandLines;
  for (auto const& config : configs) {
    commandLines.push_back(cmMakeCommandLine(
      { cmSystemTools::GetCMakeCommand(), "-E", "cmake_autogen",
        this->AutogenTarget.InfoFile, config }));
  }

  // Use PRE_BUILD on demand
  bool usePRE_BUILD = false;
  if (this->GlobalGen->GetName().find("Visual Studio") != std::string::npos) {
    // Under VS use a PRE_BUILD event instead of a separate target to
    // reduce the number of targets loaded into the IDE.
    // This also works around a VS 11 bug that may skip updating the target:
    //  https://connect.microsoft.com/VisualStudio/feedback/details/769495
    usePRE_BUILD = true;
  }
  // Disable PRE_BUILD in some cases
  if (usePRE_BUILD) {
    // Cannot use PRE_BUILD with file depends
    if (!this->AutogenTarget.DependFiles.empty()) {
      usePRE_BUILD = false;
    }
    // Cannot use PRE_BUILD when a global autogen target is in place
    if (this->AutogenTarget.GlobalTarget) {
      usePRE_BUILD = false;
    }
  }
  // Create the autogen target/command
  if (usePRE_BUILD) {
    // Add additional autogen target dependencies to origin target
    for (cmTarget* depTarget : this->AutogenTarget.DependTargets) {
      this->GenTarget->Target->AddUtility(depTarget->GetName(), false,
                                          this->Makefile);
    }

    if (!this->Uic.UiFilesNoOptions.empty() ||
        !this->Uic.UiFilesWithOptions.empty()) {
      // Add a generated timestamp file
      ConfigString timestampFile;
      std::string timestampFileGenex;
      ConfigFileNamesAndGenex(timestampFile, timestampFileGenex,
                              cmStrCat(this->Dir.Build, "/autouic"_s),
                              ".stamp"_s);
      this->AddGeneratedSource(timestampFile, this->Uic);

      // Add a step in the pre-build command to touch the timestamp file
      commandLines.push_back(
        cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), "-E", "touch",
                            timestampFileGenex }));

      // UIC needs to be re-run if any of the known UI files change or the
      // executable itself has been updated
      auto uicDependencies = this->Uic.UiFilesNoOptions;
      for (auto const& uiFile : this->Uic.UiFilesWithOptions) {
        uicDependencies.push_back(uiFile.first);
      }
      AddAutogenExecutableToDependencies(this->Uic, uicDependencies);

      // Add a rule file to cause the target to build if a dependency has
      // changed, which will trigger the pre-build command to run autogen
      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(timestampFileGenex);
      cc->SetDepends(uicDependencies);
      cc->SetComment("");
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetCMP0116Status(cmPolicies::NEW);
      cc->SetEscapeOldStyle(false);
      cc->SetStdPipesUTF8(stdPipesUTF8);
      this->LocalGen->AddCustomCommandToOutput(std::move(cc));
    }

    // Add the pre-build command directly to bypass the OBJECT_LIBRARY
    // rejection in cmMakefile::AddCustomCommandToTarget because we know
    // PRE_BUILD will work for an OBJECT_LIBRARY in this specific case.
    //
    // PRE_BUILD does not support file dependencies!
    cmCustomCommand cc;
    cc.SetByproducts(autogenByproducts);
    cc.SetCommandLines(commandLines);
    cc.SetComment(autogenComment.c_str());
    cc.SetBacktrace(this->Makefile->GetBacktrace());
    cc.SetWorkingDirectory(this->Dir.Work.c_str());
    cc.SetStdPipesUTF8(stdPipesUTF8);
    cc.SetEscapeOldStyle(false);
    cc.SetEscapeAllowMakeVars(true);
    this->GenTarget->Target->AddPreBuildCommand(std::move(cc));
  } else {

    // Add link library target dependencies to the autogen target
    // dependencies
    if (this->AutogenTarget.DependOrigin) {
      // add_dependencies/addUtility do not support generator expressions.
      // We depend only on the libraries found in all configs therefore.
      std::map<cmGeneratorTarget const*, std::size_t> commonTargets;
      for (std::string const& config : this->ConfigsList) {
        cmLinkImplementationLibraries const* libs =
          this->GenTarget->GetLinkImplementationLibraries(
            config, cmGeneratorTarget::LinkInterfaceFor::Link);
        if (libs) {
          for (cmLinkItem const& item : libs->Libraries) {
            cmGeneratorTarget const* libTarget = item.Target;
            if (libTarget &&
                !StaticLibraryCycle(this->GenTarget, libTarget, config)) {
              // Increment target config count
              commonTargets[libTarget]++;
            }
          }
        }
      }
      for (auto const& item : commonTargets) {
        if (item.second == this->ConfigsList.size()) {
          this->AutogenTarget.DependTargets.insert(item.first->Target);
        }
      }
    }

    std::vector<std::string> dependencies(
      this->AutogenTarget.DependFiles.begin(),
      this->AutogenTarget.DependFiles.end());

    if (useNinjaDepfile) {
      // Create a custom command that generates a timestamp file and
      // has a depfile assigned. The depfile is created by JobDepFilesMergeT.
      //
      // Also create an additional '_autogen_timestamp_deps' that the custom
      // command will depend on. It will have no sources or commands to
      // execute, but it will have dependencies that would originally be
      // assigned to the pre-Qt 5.15 'autogen' target. These dependencies will
      // serve as a list of order-only dependencies for the custom command,
      // without forcing the custom command to re-execute.
      //
      // The dependency tree would then look like
      // '_autogen_timestamp_deps (order-only)' <- '/timestamp' file <-
      // '_autogen' target.
      const auto timestampTargetName =
        cmStrCat(this->GenTarget->GetName(), "_autogen_timestamp_deps");
      std::vector<std::string> timestampTargetProvides;
      cmCustomCommandLines timestampTargetCommandLines;

      // Add additional autogen target dependencies to
      // '_autogen_timestamp_deps'.
      for (const cmTarget* t : this->AutogenTarget.DependTargets) {
        std::string depname = t->GetName();
        if (t->IsImported()) {
          auto ttype = t->GetType();
          if (ttype == cmStateEnums::TargetType::STATIC_LIBRARY ||
              ttype == cmStateEnums::TargetType::SHARED_LIBRARY ||
              ttype == cmStateEnums::TargetType::UNKNOWN_LIBRARY) {
            depname = cmStrCat("$<TARGET_LINKER_FILE:", t->GetName(), ">");
          }
        }
        dependencies.push_back(depname);
      }

      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetByproducts(timestampTargetProvides);
      cc->SetDepends(dependencies);
      cc->SetCommandLines(timestampTargetCommandLines);
      cc->SetCMP0116Status(cmPolicies::NEW);
      cc->SetEscapeOldStyle(false);
      cmTarget* timestampTarget = this->LocalGen->AddUtilityCommand(
        timestampTargetName, true, std::move(cc));
      this->LocalGen->AddGeneratorTarget(
        cm::make_unique<cmGeneratorTarget>(timestampTarget, this->LocalGen));

      // Set FOLDER property on the timestamp target, so it appears in the
      // appropriate folder in an IDE or in the file api.
      if (!this->TargetsFolder.empty()) {
        timestampTarget->SetProperty("FOLDER", this->TargetsFolder);
      }

      // Make '/timestamp' file depend on '_autogen_timestamp_deps' and on the
      // moc and uic executables (whichever are enabled).
      dependencies.clear();
      dependencies.push_back(timestampTargetName);

      AddAutogenExecutableToDependencies(this->Moc, dependencies);
      AddAutogenExecutableToDependencies(this->Uic, dependencies);

      // Create the custom command that outputs the timestamp file.
      const char timestampFileName[] = "timestamp";
      const std::string outputFile =
        cmStrCat(this->Dir.Build, "/", timestampFileName);
      this->AutogenTarget.DepFile = cmStrCat(this->Dir.Build, "/deps");
      this->AutogenTarget.DepFileRuleName =
        cmStrCat(this->Dir.RelativeBuild, "/", timestampFileName);
      commandLines.push_back(cmMakeCommandLine(
        { cmSystemTools::GetCMakeCommand(), "-E", "touch", outputFile }));

      this->AddGeneratedSource(outputFile, this->Moc);
      cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(outputFile);
      cc->SetByproducts(timestampByproducts);
      cc->SetDepends(dependencies);
      cc->SetCommandLines(commandLines);
      cc->SetComment(autogenComment.c_str());
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetCMP0116Status(cmPolicies::NEW);
      cc->SetEscapeOldStyle(false);
      cc->SetDepfile(this->AutogenTarget.DepFile);
      cc->SetStdPipesUTF8(stdPipesUTF8);
      this->LocalGen->AddCustomCommandToOutput(std::move(cc));

      // Alter variables for the autogen target which now merely wraps the
      // custom command
      dependencies.clear();
      dependencies.push_back(outputFile);
      commandLines.clear();
      autogenComment.clear();
    }

    // Create autogen target
    auto cc = cm::make_unique<cmCustomCommand>();
    cc->SetWorkingDirectory(this->Dir.Work.c_str());
    cc->SetByproducts(autogenByproducts);
    cc->SetDepends(dependencies);
    cc->SetCommandLines(commandLines);
    cc->SetCMP0116Status(cmPolicies::NEW);
    cc->SetEscapeOldStyle(false);
    cc->SetComment(autogenComment.c_str());
    cmTarget* autogenTarget = this->LocalGen->AddUtilityCommand(
      this->AutogenTarget.Name, true, std::move(cc));
    // Create autogen generator target
    this->LocalGen->AddGeneratorTarget(
      cm::make_unique<cmGeneratorTarget>(autogenTarget, this->LocalGen));

    // Forward origin utilities to autogen target
    if (this->AutogenTarget.DependOrigin) {
      for (BT<std::pair<std::string, bool>> const& depName :
           this->GenTarget->GetUtilities()) {
        autogenTarget->AddUtility(depName.Value.first, false, this->Makefile);
      }
    }
    if (!useNinjaDepfile) {
      // Add additional autogen target dependencies to autogen target
      for (cmTarget* depTarget : this->AutogenTarget.DependTargets) {
        autogenTarget->AddUtility(depTarget->GetName(), false, this->Makefile);
      }
    }

    // Set FOLDER property in autogen target
    if (!this->TargetsFolder.empty()) {
      autogenTarget->SetProperty("FOLDER", this->TargetsFolder);
    }

    // Add autogen target to the origin target dependencies
    this->GenTarget->Target->AddUtility(this->AutogenTarget.Name, false,
                                        this->Makefile);

    // Add autogen target to the global autogen target dependencies
    if (this->AutogenTarget.GlobalTarget) {
      this->GlobalInitializer->AddToGlobalAutoGen(this->LocalGen,
                                                  this->AutogenTarget.Name);
    }
  }

  return true;
}